

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzp.cpp
# Opt level: O0

void __thiscall mg::data::Mzp::MzpArchiveEntry::print(MzpArchiveEntry *this)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  FILE *__stream;
  uint32_t uVar7;
  MzpArchiveEntry *this_local;
  
  __stream = _stderr;
  uVar1 = this->sector_offset;
  uVar2 = this->byte_offset;
  uVar3 = this->size_sectors;
  uVar4 = this->size_bytes;
  uVar5 = this->sector_offset;
  uVar6 = this->byte_offset;
  uVar7 = entry_data_size(this);
  fprintf(__stream,
          "MzpArchiveEntry:\n    Sector offset:   %08x\n    Byte offset:     %08x\n    Size sectors:    %08x\n    Size lowbytes:   %08x\n    True offset:     %08x\n    True size:       %08x\n"
          ,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,(uint)uVar5 * 0x800 + (uint)uVar6,
          uVar7);
  return;
}

Assistant:

void Mzp::MzpArchiveEntry::print() {
  fprintf(stderr,
          "MzpArchiveEntry:\n"
          "    Sector offset:   %08x\n"
          "    Byte offset:     %08x\n"
          "    Size sectors:    %08x\n"
          "    Size lowbytes:   %08x\n"
          "    True offset:     %08x\n"
          "    True size:       %08x\n",
          sector_offset, byte_offset, size_sectors, size_bytes,
          (sector_offset * SECTOR_SIZE) + byte_offset, entry_data_size());
}